

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageHandler.cpp
# Opt level: O3

int __thiscall ImageHandler::preProcess(ImageHandler *this,string *inFile,string *targetName)

{
  char cVar1;
  int iVar2;
  allocator local_a1;
  long *local_a0 [2];
  long local_90 [2];
  string local_80 [96];
  
  std::__cxx11::string::string((string *)local_a0,(inFile->_M_dataplus)._M_p,&local_a1);
  cv::imread(local_80,(int)(string *)local_a0);
  cv::Mat::operator=(&this->m_img,(Mat *)local_80);
  cv::Mat::~Mat((Mat *)local_80);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  cVar1 = cv::Mat::empty();
  if (cVar1 == '\0') {
    std::__cxx11::string::_M_assign((string *)&this->m_targetName);
    iVar2 = 0;
  }
  else {
    preProcess((ImageHandler *)inFile);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int ImageHandler::preProcess(const std::string &inFile, const std::string &targetName) 
{
    m_img = cv::imread(inFile.c_str(), 1);
    if (m_img.empty()) 
    {
        fprintf(stderr, "cv::imread %s failed\n", inFile.c_str());
        return -1;
    }

    m_targetName = targetName;
    return 0;
}